

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

float __thiscall Rml::Element::GetScrollHeight(Element *this)

{
  float fVar1;
  float fVar2;
  
  fVar2 = (this->scrollable_overflow_rectangle).y;
  fVar1 = GetClientHeight(this);
  if (fVar2 <= fVar1) {
    fVar2 = fVar1;
  }
  return fVar2;
}

Assistant:

float Element::GetScrollHeight()
{
	return Math::Max(scrollable_overflow_rectangle.y, GetClientHeight());
}